

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall
IRBuilder::BuildElementC2
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot instanceSlot,RegSlot value2Slot,
          RegSlot regSlot,PropertyIdIndexType propertyIdIndex)

{
  code *pcVar1;
  bool bVar2;
  PropertyId PVar3;
  JITTimeFunctionBody *pJVar4;
  SymOpnd *this_00;
  PropertySymOpnd *pPVar5;
  SymOpnd *this_01;
  RegOpnd *src2Opnd;
  ProfiledInstr *instr;
  JITTimeProfileInfo *this_02;
  TSize *pTVar6;
  undefined4 *puVar7;
  undefined6 in_register_00000032;
  Func *func;
  OpCode local_32 [4];
  OpCode newOpcode_local;
  
  local_32[0] = newOpcode;
  switch((int)CONCAT62(in_register_00000032,newOpcode)) {
  case 0x122:
    Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(local_32);
  case 0x121:
    pJVar4 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    PVar3 = JITTimeFunctionBody::GetPropertyIdFromCacheId(pJVar4,propertyIdIndex);
    this_01 = BuildFieldOpnd(this,local_32[0],instanceSlot,PVar3,0xffffffff,PropertyKindData,
                             propertyIdIndex);
    bVar2 = IR::SymOpnd::IsPropertySymOpnd(this_01);
    if (((bVar2) &&
        (pPVar5 = IR::Opnd::AsPropertySymOpnd(&this_01->super_Opnd),
        pPVar5->m_runtimePolymorphicInlineCache != (JITTimePolymorphicInlineCache *)0x0)) &&
       (-1 < (char)pPVar5->m_polyCacheUtil)) {
      pPVar5->m_runtimePolymorphicInlineCache = (JITTimePolymorphicInlineCache *)0x0;
    }
    src2Opnd = BuildSrcOpnd(this,value2Slot,TyVar);
    this_00 = (SymOpnd *)BuildDstOpnd(this,regSlot,TyVar,false,false);
    func = this->m_func;
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x139b,"((0))","Unknown ElementC2 opcode");
    if (bVar2) {
      *puVar7 = 0;
      Js::Throw::FatalInternalError(-0x7fffbffb);
    }
    goto LAB_004d9a8f;
  case 0x128:
  case 0x12a:
    Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(local_32);
  case 0x127:
  case 0x129:
    pJVar4 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    PVar3 = JITTimeFunctionBody::GetPropertyIdFromCacheId(pJVar4,propertyIdIndex);
    this_00 = BuildFieldOpnd(this,local_32[0],instanceSlot,PVar3,0xffffffff,PropertyKindData,
                             propertyIdIndex);
    bVar2 = IR::SymOpnd::IsPropertySymOpnd(this_00);
    if (((bVar2) &&
        (pPVar5 = IR::Opnd::AsPropertySymOpnd(&this_00->super_Opnd),
        pPVar5->m_runtimePolymorphicInlineCache != (JITTimePolymorphicInlineCache *)0x0)) &&
       (-1 < (char)pPVar5->m_polyCacheUtil)) {
      pPVar5->m_runtimePolymorphicInlineCache = (JITTimePolymorphicInlineCache *)0x0;
    }
    this_01 = (SymOpnd *)BuildSrcOpnd(this,regSlot,TyVar);
    src2Opnd = BuildSrcOpnd(this,value2Slot,TyVar);
    func = this->m_func;
  }
  instr = IR::ProfiledInstr::New
                    (local_32[0],&this_00->super_Opnd,&this_01->super_Opnd,&src2Opnd->super_Opnd,
                     func);
  pJVar4 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  this_02 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar4);
  pTVar6 = (TSize *)JITTimeProfileInfo::GetFldInfo(this_02,propertyIdIndex);
  if ((instr->super_Instr).m_kind != InstrKindProfiled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
    if (!bVar2) {
LAB_004d9a8f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
  }
  (instr->u).field_3.fldInfoData = *pTVar6;
  AddInstr(this,&instr->super_Instr,offset);
  return;
}

Assistant:

void
IRBuilder::BuildElementC2(Js::OpCode newOpcode, uint32 offset, Js::RegSlot instanceSlot, Js::RegSlot value2Slot,
                                Js::RegSlot regSlot, Js::PropertyIdIndexType propertyIdIndex)
{
    IR::Instr *     instr = nullptr;

    Js::PropertyId  propertyId;
    IR::RegOpnd *   regOpnd;
    IR::RegOpnd *   value2Opnd;
    IR::SymOpnd * fieldSymOpnd;

    switch (newOpcode)
    {
    case Js::OpCode::ProfiledLdSuperFld:
        Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(newOpcode);
        // fall-through

    case Js::OpCode::LdSuperFld:
        {
            propertyId = m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(propertyIdIndex);
            fieldSymOpnd = this->BuildFieldOpnd(newOpcode, instanceSlot, propertyId, (Js::PropertyIdIndexType) - 1, PropertyKindData, propertyIdIndex);
            if (fieldSymOpnd->IsPropertySymOpnd())
            {
                fieldSymOpnd->AsPropertySymOpnd()->TryDisableRuntimePolymorphicCache();
            }

            value2Opnd = this->BuildSrcOpnd(value2Slot);
            regOpnd = this->BuildDstOpnd(regSlot);

            instr = IR::ProfiledInstr::New(newOpcode, regOpnd, fieldSymOpnd, value2Opnd, m_func);
            instr->AsProfiledInstr()->u.FldInfo() = *(m_func->GetReadOnlyProfileInfo()->GetFldInfo(propertyIdIndex));
            this->AddInstr(instr, offset);
        }
        break;

    case Js::OpCode::ProfiledStSuperFld:
    case Js::OpCode::ProfiledStSuperFldStrict:
        Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(newOpcode);
        // fall-through

    case Js::OpCode::StSuperFld:
    case Js::OpCode::StSuperFldStrict:
    {
        propertyId = m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(propertyIdIndex);
        fieldSymOpnd = this->BuildFieldOpnd(newOpcode, instanceSlot, propertyId, (Js::PropertyIdIndexType) - 1, PropertyKindData, propertyIdIndex);
        if (fieldSymOpnd->IsPropertySymOpnd())
        {
            fieldSymOpnd->AsPropertySymOpnd()->TryDisableRuntimePolymorphicCache();
        }

        regOpnd = this->BuildSrcOpnd(regSlot);
        value2Opnd = this->BuildSrcOpnd(value2Slot);

        instr = IR::ProfiledInstr::New(newOpcode, fieldSymOpnd, regOpnd, value2Opnd, m_func);
        instr->AsProfiledInstr()->u.FldInfo() = *(m_func->GetReadOnlyProfileInfo()->GetFldInfo(propertyIdIndex));
        this->AddInstr(instr, offset);
        break;
    }

    default:
        AssertMsg(UNREACHED, "Unknown ElementC2 opcode");
        Fatal();
    }
}